

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_mul8_ppc(void *d,void *a,void *b,uint32_t desc)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    *(char *)((long)d + uVar1) = *(char *)((long)b + uVar1) * *(char *)((long)a + uVar1);
    uVar1 = uVar1 + 1;
  } while ((desc * 8 & 0xff) + 8 != uVar1);
  if ((desc >> 2 & 0xf8) <= (desc * 8 & 0xff)) {
    return;
  }
  helper_gvec_mul8_ppc_cold_1();
  return;
}

Assistant:

void HELPER(gvec_mul8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        *(uint8_t *)((char *)d + i) = *(uint8_t *)((char *)a + i) * *(uint8_t *)((char *)b + i);
    }
    clear_high(d, oprsz, desc);
}